

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *this_01;
  int iVar1;
  Index IVar2;
  undefined4 extraout_var;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_110;
  Vector dx;
  Vector x0;
  Scalar local_c8;
  Scalar local_c0;
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  Vector3 v1;
  Matrix3 v;
  Vector3 v2;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            ((ConstantReturnType *)&v,0x23,1,&dxFactor);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_110,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&v);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x30,(Vector *)&local_110);
  free(local_110.m_xpr);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_001fd248;
  this_01 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem(this_01,dt);
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&local_110,6,6);
  v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0001
  ;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&v,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                     *)&local_110,(double *)&v1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->forceVariance_,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&v);
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withAbsolutePos_ = false;
  this->withComBias_ = false;
  this->withUnmodeledForces_ = false;
  this->limitOn_ = true;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(this_01);
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,IVar2);
  KalmanFilterBase::setStateSize(&this_00->super_KalmanFilterBase,this->stateSize_);
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,IVar2);
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  this->inputSize_ = IVar2;
  resetCovarianceMatrices(this);
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            ((ConstantReturnType *)&v,CONCAT44(extraout_var,iVar1),1,&dxFactor);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&dx,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&v);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,&dx,3,3);
  local_110.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)0x3f1a36e2eb1c432d;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setConstant
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v,
             (Scalar *)&local_110);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,&dx,9,3);
  local_110.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)0x3f1a36e2eb1c432d;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::setConstant
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)&v,
             (Scalar *)&local_110);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_b8,(DenseStorage<double,__1,__1,_1,_0> *)&dx);
  EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
            (&this->super_EKFFlexibilityEstimatorBase,(Vector *)&local_b8);
  free(local_b8.m_data);
  ObserverBase::stateVectorZero((ObserverBase *)&x0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&(this->super_EKFFlexibilityEstimatorBase).lastX_,&x0);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,&x0,0);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->Q_);
  ExtendedKalmanFilter::setFunctor(this_00,&this_01->super_DynamicalSystemFunctorBase);
  IMUElasticLocalFrameDynamicalSystem::setFDstep
            (this_01,&(this->super_EKFFlexibilityEstimatorBase).dx_);
  this->on_ = true;
  local_110.m_xpr = &v1;
  local_110.m_row = 0;
  local_110.m_col = 1;
  local_110.m_currentBlockRows = 1;
  v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 100.0;
  local_c0 = 100.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_110,&local_c0);
  local_c8 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_110);
  local_110.m_row = 0;
  local_110.m_col = 1;
  local_110.m_currentBlockRows = 1;
  v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 10.0;
  local_c0 = 10.0;
  local_110.m_xpr = &v2;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_110,&local_c0);
  local_c8 = 100.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_110);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false>::run(&v);
  local_110.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)0x4081651eb851eb85;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&v,(Scalar *)&local_110);
  local_110.m_row = (Index)&v1;
  local_110.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&v;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (&this->limitForces_,
             (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)&local_110);
  local_110.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&v;
  local_110.m_row = (Index)&v2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (&this->limitTorques_,
             (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)&local_110);
  free(x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt)
: EKFFlexibilityEstimatorBase(stateSize,
                              measurementSizeBase_,
                              inputSizeBase_,
                              Matrix::Constant(stateSize, 1, dxFactor)),
  functor_(dt), stateSize_(stateSize), unmodeledForceVariance_(1e-6), forceVariance_(Matrix::Identity(6, 6) * 1e-4),
  absPosVariance_(1e-4), useFTSensors_(false), withAbsolutePos_(false), withComBias_(false),
  withUnmodeledForces_(false), limitOn_(true)
{
  ekf_.setMeasureSize(functor_.getMeasurementSize());
  ekf_.setStateSize(stateSize_);
  ekf_.setInputSize(functor_.getInputSize());
  inputSize_ = functor_.getInputSize();

  ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

  Vector dx(Matrix::Constant(getStateSize(), 1, dxFactor));

  dx.segment(state::ori, 3).fill(1e-4);
  dx.segment(state::angVel, 3).fill(1e-4);

  ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

  Vector x0(ekf_.stateVectorZero());

  lastX_ = x0;
  ekf_.setState(x0, 0);

  ekf_.setStateCovariance(Q_);

  ekf_.setFunctor(&functor_);

  functor_.setFDstep(dx_);

  on_ = true;

  Vector3 v1, v2;
  Matrix3 v;
  v1 << 100, 100, 1000;
  v2 << 10, 10, 100;
  v.setIdentity();
  v *= cst::gravityConstant * hrp2::m;
  limitForces_ = v * v1;
  limitTorques_ = v * v2;
}